

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void Action_add(action **app,e_action type,symbol *sp,char *arg)

{
  undefined1 auVar1 [16];
  action *__s;
  long lVar2;
  undefined1 auVar3 [16];
  long lVar4;
  
  __s = Action_new_actionfreelist;
  if (Action_new_actionfreelist == (action *)0x0) {
    __s = (action *)lemon_malloc(4000);
    memset(__s,0,0xf98);
    auVar1 = _DAT_0010d020;
    lVar2 = 0x48;
    auVar3 = _DAT_0010d010;
    do {
      lVar4 = auVar3._8_8_;
      if (SUB164(auVar3 ^ auVar1,4) == -0x80000000 && SUB164(auVar3 ^ auVar1,0) < -0x7fffff9d) {
        *(action **)((long)&__s[-1].sp + lVar2) = __s + auVar3._0_8_ + 1;
        *(action **)((long)&__s->sp + lVar2) = __s + lVar4 + 1;
      }
      auVar3._0_8_ = auVar3._0_8_ + 2;
      auVar3._8_8_ = lVar4 + 2;
      lVar2 = lVar2 + 0x50;
    } while (lVar2 != 0xfe8);
    __s[99].next = (action *)0x0;
  }
  Action_new_actionfreelist = __s->next;
  __s->next = *app;
  *app = __s;
  __s->type = type;
  __s->sp = sp;
  __s->spOpt = (symbol *)0x0;
  (__s->x).stp = (state *)arg;
  return;
}

Assistant:

void Action_add(
  struct action **app,
  enum e_action type,
  struct symbol *sp,
  char *arg
){
  struct action *newaction;
  newaction = Action_new();
  newaction->next = *app;
  *app = newaction;
  newaction->type = type;
  newaction->sp = sp;
  newaction->spOpt = 0;
  if( type==SHIFT ){
    newaction->x.stp = (struct state *)arg;
  }else{
    newaction->x.rp = (struct rule *)arg;
  }
}